

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UnificationWithAbstraction.cpp
# Opt level: O0

uint Kernel::
     FloorUwaState<Kernel::AlascaSignature<Kernel::NumTraits<Kernel::RationalConstantType>_>_>::
     Bucket::hash(Term *t)

{
  uint uVar1;
  undefined8 in_RDI;
  undefined4 in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffac;
  Option<unsigned_int> *in_stack_ffffffffffffffb0;
  Option<unsigned_int> *in_stack_ffffffffffffffb8;
  undefined1 local_2c [12];
  undefined1 local_20 [24];
  undefined8 local_8;
  
  local_8 = in_RDI;
  AlascaSignature<Kernel::NumTraits<Kernel::RationalConstantType>>::
  ifLinMul<Kernel::FloorUwaState<Kernel::AlascaSignature<Kernel::NumTraits<Kernel::RationalConstantType>>>::Bucket::hash(Kernel::Term*)::_lambda(auto:1&,auto:2)_1_>
            (local_20,in_RDI);
  NumTraits<Kernel::RationalConstantType>::
  ifFloor<Kernel::FloorUwaState<Kernel::AlascaSignature<Kernel::NumTraits<Kernel::RationalConstantType>>>::Bucket::hash(Kernel::Term*)::_lambda(auto:1)_1_>
            (local_2c,local_8);
  Lib::operator||(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
  NumTraits<Kernel::RationalConstantType>::
  ifAdd<Kernel::FloorUwaState<Kernel::AlascaSignature<Kernel::NumTraits<Kernel::RationalConstantType>>>::Bucket::hash(Kernel::Term*)::_lambda(auto:1,auto:2)_1_>
            (&stack0xffffffffffffffbc,local_8);
  Lib::operator||(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
  uVar1 = Lib::operator||((Option<unsigned_int> *)
                          CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                          (anon_class_8_1_54a39814)&local_8);
  Lib::Option<unsigned_int>::~Option((Option<unsigned_int> *)0x9ec96f);
  Lib::Option<unsigned_int>::~Option((Option<unsigned_int> *)0x9ec979);
  Lib::Option<unsigned_int>::~Option((Option<unsigned_int> *)0x9ec983);
  Lib::Option<unsigned_int>::~Option((Option<unsigned_int> *)0x9ec98d);
  Lib::Option<unsigned_int>::~Option((Option<unsigned_int> *)0x9ec997);
  return uVar1;
}

Assistant:

static unsigned hash(Term* t) { 
      return ASig::ifLinMul(t, [](auto& k, auto t) { return hash(t.term()); })
          || ASig::ifFloor(t, [](auto t) { return 2 * hash(t.term()) + 1; })
          || ASig::ifAdd(t, [](auto l, auto r) { return hash(l.term()) + hash(r.term()); })
          || [&]() { return 2 * t->functor(); };
    }